

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaAddItemSize(xmlSchemaItemListPtr *list,int initialSize,void *item)

{
  int iVar1;
  xmlSchemaItemListPtr list_00;
  
  list_00 = *list;
  if (list_00 == (xmlSchemaItemListPtr)0x0) {
    list_00 = xmlSchemaItemListCreate();
    *list = list_00;
    if (list_00 == (xmlSchemaItemListPtr)0x0) {
      return 0;
    }
  }
  iVar1 = xmlSchemaItemListAddSize(list_00,initialSize,item);
  return iVar1;
}

Assistant:

static int
xmlSchemaAddItemSize(xmlSchemaItemListPtr *list, int initialSize, void *item)
{
    if (*list == NULL) {
	*list = xmlSchemaItemListCreate();
	if (*list == NULL)
	    return(-1);
    }
    xmlSchemaItemListAddSize(*list, initialSize, item);
    return(0);
}